

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5.hpp
# Opt level: O1

void __thiscall trng::mrg5::backward(mrg5 *this)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int32_t iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  
  iVar7 = (this->P).a[4];
  if (iVar7 == 0) {
    iVar7 = (this->P).a[3];
    if (iVar7 != 0) {
      lVar8 = (long)(this->S).r[1] * (long)(this->P).a[0];
      auVar1 = SEXT816(lVar8) * ZEXT816(0x8000000100000003);
      iVar4 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar8) +
              (this->S).r[0];
      iVar3 = iVar4 + 0x7fffffff;
      if (-1 < iVar4) {
        iVar3 = iVar4;
      }
      lVar8 = (long)(this->S).r[2] * (long)(this->P).a[1];
      auVar1 = SEXT816(lVar8) * ZEXT816(0x8000000100000003);
      iVar3 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar8) +
              iVar3;
      iVar4 = iVar3 + 0x7fffffff;
      if (-1 < iVar3) {
        iVar4 = iVar3;
      }
      iVar3 = (this->P).a[2];
LAB_00111ad8:
      iVar9 = (this->S).r[3];
      goto LAB_00111adc;
    }
    iVar7 = (this->P).a[2];
    if (iVar7 != 0) {
      lVar8 = (long)(this->S).r[2] * (long)(this->P).a[0];
      auVar1 = SEXT816(lVar8) * ZEXT816(0x8000000100000003);
      iVar3 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar8) +
              (this->S).r[1];
      iVar4 = iVar3 + 0x7fffffff;
      if (-1 < iVar3) {
        iVar4 = iVar3;
      }
      iVar3 = (this->P).a[1];
      goto LAB_00111ad8;
    }
    iVar7 = (this->P).a[1];
    if (iVar7 != 0) {
      iVar4 = (this->S).r[2];
      lVar8 = (long)(this->S).r[3] * (long)(this->P).a[0];
      auVar1 = SEXT816(lVar8) * ZEXT816(0x8000000100000003);
      iVar3 = ((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar8;
      iVar9 = iVar4 + iVar3;
      iVar4 = iVar4 + iVar3 + 0x7fffffff;
      if (-1 < iVar9) {
        iVar4 = iVar9;
      }
      uVar11 = (ulong)iVar4;
      goto LAB_00111b0c;
    }
    iVar6 = (this->P).a[0];
    if (iVar6 == 0) {
      iVar7 = 0;
      goto LAB_00111b3a;
    }
    iVar7 = (this->S).r[3];
    iVar6 = int_math::modulo_inverse(iVar6,0x7fffffff);
    lVar8 = (long)iVar6 * (long)iVar7;
    lVar10 = SUB168(SEXT816(lVar8) * SEXT816(-0x7ffffffefffffffd),8);
  }
  else {
    lVar8 = (long)(this->S).r[1] * (long)(this->P).a[0];
    auVar1 = SEXT816(lVar8) * ZEXT816(0x8000000100000003);
    iVar3 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar8) +
            (this->S).r[0];
    iVar4 = iVar3 + 0x7fffffff;
    if (-1 < iVar3) {
      iVar4 = iVar3;
    }
    lVar8 = (long)(this->S).r[2] * (long)(this->P).a[1];
    auVar1 = SEXT816(lVar8) * ZEXT816(0x8000000100000003);
    iVar4 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar8) +
            iVar4;
    iVar3 = iVar4 + 0x7fffffff;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
    lVar8 = (long)(this->S).r[3] * (long)(this->P).a[2];
    auVar1 = SEXT816(lVar8) * ZEXT816(0x8000000100000003);
    iVar3 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar8) +
            iVar3;
    iVar4 = iVar3 + 0x7fffffff;
    if (-1 < iVar3) {
      iVar4 = iVar3;
    }
    iVar3 = (this->P).a[3];
    iVar9 = (this->S).r[4];
LAB_00111adc:
    auVar1 = SEXT816((long)iVar9 * (long)iVar3) * ZEXT816(0x8000000100000003);
    uVar5 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff -
            (int)((long)iVar9 * (long)iVar3)) + iVar4;
    uVar11 = (ulong)(uVar5 + 0x7fffffff);
    if (-1 < (int)uVar5) {
      uVar11 = (ulong)uVar5;
    }
LAB_00111b0c:
    iVar6 = int_math::modulo_inverse(iVar7,0x7fffffff);
    lVar8 = (long)iVar6 * uVar11;
    lVar10 = SUB168(SEXT816(lVar8) * SEXT816(-0x7ffffffefffffffd),8);
  }
  iVar7 = (int)lVar8 +
          ((int)((ulong)(lVar10 + lVar8) >> 0x1e) - (int)(lVar10 + lVar8 >> 0x3f)) * -0x7fffffff;
LAB_00111b3a:
  uVar2 = *(undefined8 *)((this->S).r + 3);
  *(undefined8 *)(this->S).r = *(undefined8 *)((this->S).r + 1);
  *(undefined8 *)((this->S).r + 2) = uVar2;
  (this->S).r[4] = iVar7;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg5::backward() {
    result_type t;
    if (P.a[4] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[3]) * static_cast<int64_t>(S.r[4])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[4], modulus))) %
          modulus);
    } else if (P.a[3] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[3], modulus))) %
          modulus);
    } else if (P.a[2] != 0) {
      t = S.r[1];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[2], modulus))) %
          modulus);
    } else if (P.a[1] != 0) {
      t = S.r[2];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[3];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = S.r[2];
    S.r[2] = S.r[3];
    S.r[3] = S.r[4];
    S.r[4] = t;
  }